

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2Impl::norm16HasDecompBoundaryAfter(Normalizer2Impl *this,uint16_t norm16)

{
  ushort uVar1;
  UBool UVar2;
  uint16_t *puVar3;
  bool local_3a;
  bool local_39;
  uint16_t firstUnit;
  uint16_t *mapping;
  uint16_t norm16_local;
  Normalizer2Impl *this_local;
  
  if ((this->minYesNo < norm16) && (UVar2 = isHangulLVT(this,norm16), UVar2 == '\0')) {
    if (norm16 < this->limitNoNo) {
      puVar3 = getMapping(this,norm16);
      uVar1 = *puVar3;
      if (uVar1 < 0x200) {
        if (uVar1 < 0x100) {
          this_local._7_1_ = true;
        }
        else {
          local_3a = true;
          if ((uVar1 & 0x80) != 0) {
            local_3a = (puVar3[-1] & 0xff00) == 0;
          }
          this_local._7_1_ = local_3a;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      UVar2 = isMaybeOrNonZeroCC(this,norm16);
      if (UVar2 == '\0') {
        this_local._7_1_ = (norm16 & 6) < 3;
      }
      else {
        local_39 = norm16 < 0xfc01 || norm16 == 0xfe00;
        this_local._7_1_ = local_39;
      }
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

UBool Normalizer2Impl::norm16HasDecompBoundaryAfter(uint16_t norm16) const {
    if(norm16 <= minYesNo || isHangulLVT(norm16)) {
        return TRUE;
    }
    if (norm16 >= limitNoNo) {
        if (isMaybeOrNonZeroCC(norm16)) {
            return norm16 <= MIN_NORMAL_MAYBE_YES || norm16 == JAMO_VT;
        }
        // Maps to an isCompYesAndZeroCC.
        return (norm16 & DELTA_TCCC_MASK) <= DELTA_TCCC_1;
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    uint16_t firstUnit=*mapping;
    // decomp after-boundary: same as hasFCDBoundaryAfter(),
    // fcd16<=1 || trailCC==0
    if(firstUnit>0x1ff) {
        return FALSE;  // trailCC>1
    }
    if(firstUnit<=0xff) {
        return TRUE;  // trailCC==0
    }
    // if(trailCC==1) test leadCC==0, same as checking for before-boundary
    // TRUE if leadCC==0 (hasFCDBoundaryBefore())
    return (firstUnit&MAPPING_HAS_CCC_LCCC_WORD)==0 || (*(mapping-1)&0xff00)==0;
}